

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::ReadBlocks
          (SingleFileBlockManager *this,FileBuffer *buffer,block_id_t start_block,idx_t block_count)

{
  optional_idx *this_00;
  data_ptr_t pdVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  type handle;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  uint64_t params;
  IOException *this_01;
  uint64_t location;
  optional_idx *this_02;
  string local_50;
  
  uVar2 = NumericCastImpl<unsigned_long,_long,_false>::Convert(start_block);
  this_00 = &(this->super_BlockManager).block_alloc_size;
  iVar3 = optional_idx::GetIndex(this_00);
  location = iVar3 * uVar2 + 0x3000;
  handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator*
                     (&this->handle);
  FileBuffer::Read(buffer,handle,location);
  if (block_count != 0) {
    pdVar1 = buffer->internal_buffer;
    this_02 = &(this->super_BlockManager).block_header_size;
    iVar3 = 0;
    do {
      iVar4 = optional_idx::GetIndex(this_00);
      uVar2 = *(unsigned_long *)(pdVar1 + iVar4 * iVar3);
      if (this_02->index == 0xffffffffffffffff) {
        iVar5 = 8;
      }
      else {
        iVar5 = optional_idx::GetIndex(this_02);
      }
      iVar6 = optional_idx::GetIndex(this_00);
      iVar7 = optional_idx::GetIndex(this_02);
      params = Checksum(pdVar1 + iVar5 + iVar4 * iVar3,iVar6 - iVar7);
      if (uVar2 != params) {
        this_01 = (IOException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Corrupt database file: computed checksum %llu does not match stored checksum %llu in block at location %llu"
                   ,"");
        iVar4 = optional_idx::GetIndex(this_00);
        IOException::IOException<unsigned_long,unsigned_long,unsigned_long>
                  (this_01,&local_50,params,uVar2,iVar4 * iVar3 + location);
        __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = iVar3 + 1;
    } while (block_count != iVar3);
  }
  return;
}

Assistant:

void SingleFileBlockManager::ReadBlocks(FileBuffer &buffer, block_id_t start_block, idx_t block_count) {
	D_ASSERT(start_block >= 0);
	D_ASSERT(block_count >= 1);

	// read the buffer from disk
	auto location = GetBlockLocation(start_block);
	buffer.Read(*handle, location);

	// for each of the blocks - verify the checksum
	auto ptr = buffer.InternalBuffer();
	for (idx_t i = 0; i < block_count; i++) {
		// compute the checksum
		auto start_ptr = ptr + i * GetBlockAllocSize();
		auto stored_checksum = Load<uint64_t>(start_ptr);
		uint64_t computed_checksum = Checksum(start_ptr + GetBlockHeaderSize(), GetBlockSize());
		// verify the checksum
		if (stored_checksum != computed_checksum) {
			throw IOException(
			    "Corrupt database file: computed checksum %llu does not match stored checksum %llu in block "
			    "at location %llu",
			    computed_checksum, stored_checksum, location + i * GetBlockAllocSize());
		}
	}
}